

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  iterator *piVar1;
  iterator *piVar2;
  iterator *piVar3;
  undefined1 auVar4 [16];
  iterator *piVar5;
  iterator *piVar6;
  bool bVar7;
  iterator *piVar8;
  iterator iVar9;
  
  piVar1 = (iterator *)a->ctrl_;
  if ((piVar1 == (iterator *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       piVar1 == (iterator *)0x0) || (-1 < (char)*(code *)&piVar1->ctrl_)) {
    piVar2 = (iterator *)b->ctrl_;
    if ((piVar2 != (iterator *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         piVar2 != (iterator *)0x0) && ((char)*(code *)&piVar2->ctrl_ < '\0')) goto LAB_00226d2a;
    if (piVar1 == (iterator *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        piVar2 == (iterator *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_00226d1d:
      return piVar1 == piVar2;
    }
    if ((piVar1 ==
        (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (piVar2 ==
        (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)) {
      if (piVar1 == (iterator *)0x0 || piVar2 == (iterator *)0x0) goto LAB_00226d1d;
      if ((piVar2 == (iterator *)&kSooControl) == (piVar1 == (iterator *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        piVar3 = (iterator *)(b->field_1).slot_;
        if (piVar1 == (iterator *)&kSooControl) {
          bVar7 = a == piVar3;
        }
        else {
          piVar8 = piVar3;
          piVar5 = piVar2;
          piVar6 = a;
          if (piVar2 < piVar1) {
            piVar8 = a;
            piVar5 = piVar1;
            piVar6 = piVar3;
          }
          b = (iterator *)CONCAT71((int7)((ulong)piVar5 >> 8),piVar5 < piVar6);
          bVar7 = piVar6 <= piVar8 && piVar5 < piVar6;
        }
        if (bVar7) goto LAB_00226d1d;
      }
      goto LAB_00226d34;
    }
  }
  else {
    operator==();
LAB_00226d2a:
    operator==();
  }
  operator==();
LAB_00226d34:
  operator==();
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  ::AssertHashEqConsistent<long>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              *)a,(long *)b);
  if (a->ctrl_ == (ctrl_t *)0x1) {
    iVar9 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
            ::find_soo<long>((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                              *)a,(key_arg<long> *)b);
    return iVar9.ctrl_._0_1_;
  }
  if (a->ctrl_ == (ctrl_t *)0x0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              *)a);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (ctrl_t *)((long)&hash_internal::MixingHashState::kSeed + (long)b->ctrl_);
  iVar9 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          ::find_non_soo<long>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                      *)a,(key_arg<long> *)b,
                     SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0));
  return iVar9.ctrl_._0_1_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }